

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_State_Test::TestBody(InterpreterTestSuite_PC_State_Test *this)

{
  TypedExpectation<ot::commissioner::State_()> *pTVar1;
  CommissionerAppMock *this_00;
  char *pcVar2;
  MockSpec<ot::commissioner::State_()> local_260;
  AssertionResult gtest_ar;
  _Any_data local_230 [4];
  Expression expr;
  ReturnAction<ot::commissioner::State> local_1c8;
  ReturnAction<ot::commissioner::State> local_1b8;
  ReturnAction<ot::commissioner::State> local_1a8;
  ReturnAction<ot::commissioner::State> local_198;
  Value value;
  TestContext ctx;
  
  this_00 = (CommissionerAppMock *)&ctx;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)this_00);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)this_00);
  local_260.function_mocker_ =
       (FunctionMocker<ot::commissioner::State_()> *)
       CommissionerAppMock::gmock_GetState
                 ((MockSpec<ot::commissioner::State_()> *)
                  ctx.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this_00
                 );
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<ot::commissioner::State_()>::InternalExpectedAt
                     (&local_260,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x3bd,"*ctx.mDefaultCommissionerObject","GetState()");
  pTVar1 = testing::internal::TypedExpectation<ot::commissioner::State_()>::Times(pTVar1,4);
  testing::internal::ReturnAction<ot::commissioner::State>::ReturnAction(&local_198,kActive);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::State_()> *)&value,(ReturnAction *)&local_198);
  pTVar1 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar1,(Action<ot::commissioner::State_()> *)&value);
  testing::internal::ReturnAction<ot::commissioner::State>::ReturnAction(&local_1a8,kPetitioning);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::State_()> *)local_230,(ReturnAction *)&local_1a8);
  pTVar1 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar1,(Action<ot::commissioner::State_()> *)local_230);
  testing::internal::ReturnAction<ot::commissioner::State>::ReturnAction(&local_1b8,kConnected);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::State_()> *)&expr,(ReturnAction *)&local_1b8);
  pTVar1 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar1,(Action<ot::commissioner::State_()> *)&expr);
  testing::internal::ReturnAction<ot::commissioner::State>::ReturnAction(&local_1c8,kDisabled);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::State_()> *)&gtest_ar,(ReturnAction *)&local_1c8);
  testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
            (pTVar1,(Action<ot::commissioner::State_()> *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c8.value_.
              super___shared_ptr<ot::commissioner::State,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&expr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b8.value_.
              super___shared_ptr<ot::commissioner::State,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_230);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.value_.
              super___shared_ptr<ot::commissioner::State,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.value_.
              super___shared_ptr<ot::commissioner::State,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.mError.mCode = kNone;
  value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_230[0]._M_pod_data,"state",(allocator *)&local_260);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar,&ctx.mInterpreter,(string *)local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  ot::commissioner::Interpreter::Eval((Value *)local_230,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_230);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_230);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_230,&value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"active\"","value.ToString().c_str()","active",
             (char *)local_230[0]._0_8_);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_230);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3c8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    if ((_func_void *)local_230[0]._0_8_ != (_func_void *)0x0) {
      (**(code **)(*(long *)local_230[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)local_230[0]._M_pod_data,"state",(allocator *)&local_260);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar,&ctx.mInterpreter,(string *)local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  ot::commissioner::Interpreter::Eval((Value *)local_230,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_230);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_230);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_230,&value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"petitioning\"","value.ToString().c_str()","petitioning",
             (char *)local_230[0]._0_8_);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_230);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    if ((_func_void *)local_230[0]._0_8_ != (_func_void *)0x0) {
      (**(code **)(*(long *)local_230[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)local_230[0]._M_pod_data,"state",(allocator *)&local_260);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar,&ctx.mInterpreter,(string *)local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  ot::commissioner::Interpreter::Eval((Value *)local_230,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_230);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_230);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_230,&value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"connected\"","value.ToString().c_str()","connected",
             (char *)local_230[0]._0_8_);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_230);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3d0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    if ((_func_void *)local_230[0]._0_8_ != (_func_void *)0x0) {
      (**(code **)(*(long *)local_230[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)local_230[0]._M_pod_data,"state",(allocator *)&local_260);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar,&ctx.mInterpreter,(string *)local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  ot::commissioner::Interpreter::Eval((Value *)local_230,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_230);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_230);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_230,&value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"disabled\"","value.ToString().c_str()","disabled",
             (char *)local_230[0]._0_8_);
  std::__cxx11::string::~string((string *)local_230[0]._M_pod_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_230);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    if ((_func_void *)local_230[0]._0_8_ != (_func_void *)0x0) {
      (**(code **)(*(long *)local_230[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ot::commissioner::Interpreter::Value::~Value(&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_State)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetState())
        .Times(4)
        .WillOnce(Return(State::kActive))
        .WillOnce(Return(State::kPetitioning))
        .WillOnce(Return(State::kConnected))
        .WillOnce(Return(State::kDisabled));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("active", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("petitioning", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("connected", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("disabled", value.ToString().c_str());
}